

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O0

bool __thiscall
draco::RAnsSymbolDecoder<4>::StartDecoding(RAnsSymbolDecoder<4> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  ulong uVar4;
  RAnsDecoder<12> *this_00;
  DecoderBuffer *in_RSI;
  unsigned_long *in_RDI;
  uint8_t *data_head;
  uint64_t bytes_encoded;
  unsigned_long *in_stack_ffffffffffffffc8;
  ulong uVar5;
  DecoderBuffer *in_stack_ffffffffffffffd8;
  ulong local_20;
  bool local_1;
  
  uVar2 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar2 < 0x200) {
    bVar1 = DecoderBuffer::Decode<unsigned_long>(in_stack_ffffffffffffffd8,in_RDI);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = DecodeVarint<unsigned_long>(in_stack_ffffffffffffffc8,(DecoderBuffer *)0x1fdfca);
    if (!bVar1) {
      return false;
    }
  }
  uVar5 = local_20;
  uVar4 = DecoderBuffer::remaining_size(in_RSI);
  if (uVar4 < uVar5) {
    local_1 = false;
  }
  else {
    this_00 = (RAnsDecoder<12> *)DecoderBuffer::data_head(in_RSI);
    iVar3 = (int)(uVar5 >> 0x20);
    DecoderBuffer::Advance(in_RSI,local_20);
    iVar3 = RAnsDecoder<12>::read_init(this_00,(uint8_t *)in_RDI,iVar3);
    if (iVar3 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RAnsSymbolDecoder<unique_symbols_bit_length_t>::StartDecoding(
    DecoderBuffer *buffer) {
  uint64_t bytes_encoded;
  // Decode the number of bytes encoded by the encoder.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!buffer->Decode(&bytes_encoded)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint<uint64_t>(&bytes_encoded, buffer)) {
      return false;
    }
  }
  if (bytes_encoded > static_cast<uint64_t>(buffer->remaining_size())) {
    return false;
  }
  const uint8_t *const data_head =
      reinterpret_cast<const uint8_t *>(buffer->data_head());
  // Advance the buffer past the rANS data.
  buffer->Advance(bytes_encoded);
  if (ans_.read_init(data_head, static_cast<int>(bytes_encoded)) != 0) {
    return false;
  }
  return true;
}